

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O0

bool iutest::TestPartResult::type_is_failed(Type type)

{
  bool bVar1;
  Fragment<128> local_11;
  Type local_10;
  bool local_9;
  Type type_local;
  
  local_10 = type;
  TestFlag::Fragment<128>::Fragment(&local_11);
  bVar1 = TestFlag::Fragment::operator_cast_to_bool((Fragment *)&local_11);
  if ((bVar1) && (local_10 == kWarning)) {
    local_9 = true;
  }
  else {
    local_9 = kSuccess < local_10;
  }
  return local_9;
}

Assistant:

static bool type_is_failed(Type type) IUTEST_CXX_NOEXCEPT_SPEC
    {
        if( iutest::IUTEST_FLAG(warning_into_error) )
        {
            if( type == kWarning )
            {
                return true;
            }
        }
        return type > kSuccess;
    }